

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O2

void __thiscall MT32Emu::TVF::nextPhase(TVF *this)

{
  bool bVar1;
  uint uVar2;
  Tables *pTVar3;
  Poly *this_00;
  uint newPhase;
  int iVar4;
  byte newIncrement;
  uint uVar5;
  uint uVar6;
  Bit8u newTarget;
  uint uVar7;
  
  pTVar3 = Tables::getInstance();
  uVar2 = this->phase;
  newPhase = uVar2 + 1;
  if (uVar2 - 4 < 2) {
    this_00 = Partial::getPoly(this->partial);
    bVar1 = Poly::canSustain(this_00);
    if (!bVar1) {
      this->phase = newPhase;
      startDecay(this);
      return;
    }
    newTarget = (Bit8u)((uint)(this->partialParam->tvf).envLevel[3] * this->levelMult >> 8);
    newIncrement = 0;
  }
  else if (uVar2 == 6) {
    newPhase = 7;
    newTarget = '\0';
    newIncrement = 0;
  }
  else {
    uVar5 = (uint)(this->partialParam->tvf).envLevel[(int)uVar2] * this->levelMult;
    uVar7 = uVar5 >> 8;
    uVar2 = (uint)(this->partialParam->tvf).envTime[(int)uVar2];
    iVar4 = uVar2 - this->keyTimeSubtraction;
    if (iVar4 == 0 || (int)uVar2 < this->keyTimeSubtraction) {
      newIncrement = (this->target <= uVar7) << 7 | 0x7f;
    }
    else {
      uVar2 = uVar7 - 1;
      if (uVar5 < 0x100) {
        uVar2 = 1;
      }
      uVar6 = uVar7 - this->target;
      if (uVar6 == 0) {
        uVar6 = (uVar5 < 0x100) - 1 | 1;
        uVar7 = uVar2;
      }
      uVar2 = -uVar6;
      if (0 < (int)uVar6) {
        uVar2 = uVar6;
      }
      uVar2 = (uint)pTVar3->envLogarithmicTime[uVar2] - iVar4;
      if ((int)uVar2 < 2) {
        uVar2 = 1;
      }
      newIncrement = (byte)(uVar6 >> 0x18) & 0x80 | (byte)uVar2;
    }
    newTarget = (Bit8u)uVar7;
  }
  startRamp(this,newTarget,newIncrement,newPhase);
  return;
}

Assistant:

void TVF::nextPhase() {
	const Tables *tables = &Tables::getInstance();
	int newPhase = phase + 1;

	switch (newPhase) {
	case PHASE_DONE:
		startRamp(0, 0, newPhase);
		return;
	case PHASE_SUSTAIN:
	case PHASE_RELEASE:
		// FIXME: Afaict newPhase should never be PHASE_RELEASE here. And if it were, this is an odd way to handle it.
		if (!partial->getPoly()->canSustain()) {
			phase = newPhase; // FIXME: Correct?
			startDecay(); // FIXME: This should actually start decay even if phase is already 6. Does that matter?
			return;
		}
		startRamp((levelMult * partialParam->tvf.envLevel[3]) >> 8, 0, newPhase);
		return;
	default:
		break;
	}

	int envPointIndex = phase;
	int envTimeSetting = partialParam->tvf.envTime[envPointIndex] - keyTimeSubtraction;

	int newTarget = (levelMult * partialParam->tvf.envLevel[envPointIndex]) >> 8;
	int newIncrement;
	if (envTimeSetting > 0) {
		int targetDelta = newTarget - target;
		if (targetDelta == 0) {
			if (newTarget == 0) {
				targetDelta = 1;
				newTarget = 1;
			} else {
				targetDelta = -1;
				newTarget--;
			}
		}
		newIncrement = tables->envLogarithmicTime[targetDelta < 0 ? -targetDelta : targetDelta] - envTimeSetting;
		if (newIncrement <= 0) {
			newIncrement = 1;
		}
		if (targetDelta < 0) {
			newIncrement |= 0x80;
		}
	} else {
		newIncrement = newTarget >= target ? (0x80 | 127) : 127;
	}
	startRamp(newTarget, newIncrement, newPhase);
}